

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__getsockpeername(uv_handle_t *handle,uv__peersockfunc func,sockaddr *name,int *namelen)

{
  int iVar1;
  int *piVar2;
  uv_os_fd_t local_38;
  int r;
  uv_os_fd_t fd;
  socklen_t socklen;
  int *namelen_local;
  sockaddr *name_local;
  uv__peersockfunc func_local;
  uv_handle_t *handle_local;
  
  _fd = namelen;
  namelen_local = (int *)name;
  name_local = (sockaddr *)func;
  func_local = (uv__peersockfunc)handle;
  handle_local._4_4_ = uv_fileno(handle,&local_38);
  if (-1 < handle_local._4_4_) {
    r = *_fd;
    iVar1 = (*(code *)name_local)(local_38,namelen_local,&r);
    if (iVar1 == 0) {
      *_fd = r;
      handle_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      handle_local._4_4_ = -*piVar2;
    }
  }
  return handle_local._4_4_;
}

Assistant:

int uv__getsockpeername(const uv_handle_t* handle,
                        uv__peersockfunc func,
                        struct sockaddr* name,
                        int* namelen) {
  socklen_t socklen;
  uv_os_fd_t fd;
  int r;

  r = uv_fileno(handle, &fd);
  if (r < 0)
    return r;

  /* sizeof(socklen_t) != sizeof(int) on some systems. */
  socklen = (socklen_t) *namelen;

  if (func(fd, name, &socklen))
    return UV__ERR(errno);

  *namelen = (int) socklen;
  return 0;
}